

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O1

void unpackforblock31(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint32_t *puVar18;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  uVar13 = puVar1[0xb];
  uVar14 = puVar1[0xc];
  uVar15 = puVar1[0xd];
  uVar16 = puVar1[0xe];
  uVar17 = puVar1[0xf];
  puVar18 = *pout;
  *pw = (uint8_t *)((long)puVar1 + 0x7c);
  puVar18[4] = ((uint)(uVar4 << 4) & 0x7fffffff | (uint)(uVar3 >> 0x3c)) + base;
  puVar18[5] = ((uint)(uVar4 >> 0x1b) & 0x7fffffff) + base;
  puVar18[6] = ((uint)(uVar5 << 6) & 0x7fffffff | (uint)(uVar4 >> 0x3a)) + base;
  puVar18[7] = ((uint)(uVar5 >> 0x19) & 0x7fffffff) + base;
  *puVar18 = ((uint)uVar2 & 0x7fffffff) + base;
  puVar18[1] = ((uint)(uVar2 >> 0x1f) & 0x7fffffff) + base;
  puVar18[2] = ((uint)(uVar3 << 2) & 0x7fffffff | (uint)(uVar2 >> 0x3e)) + base;
  puVar18[3] = ((uint)(uVar3 >> 0x1d) & 0x7fffffff) + base;
  puVar18[0xc] = ((uint)(uVar8 << 0xc) & 0x7fffffff | (uint)(uVar7 >> 0x34)) + base;
  puVar18[0xd] = ((uint)(uVar8 >> 0x13) & 0x7fffffff) + base;
  puVar18[0xe] = ((uint)(uVar9 << 0xe) & 0x7fffffff | (uint)(uVar8 >> 0x32)) + base;
  puVar18[0xf] = ((uint)(uVar9 >> 0x11) & 0x7fffffff) + base;
  puVar18[8] = ((uint)(byte)(uVar5 >> 0x38) | (uint)(uVar6 << 8) & 0x7fffffff) + base;
  puVar18[9] = ((uint)(uVar6 >> 0x17) & 0x7fffffff) + base;
  puVar18[10] = ((uint)(uVar7 << 10) & 0x7fffffff | (uint)(uVar6 >> 0x36)) + base;
  puVar18[0xb] = ((uint)(uVar7 >> 0x15) & 0x7fffffff) + base;
  puVar18[0x14] = ((uint)(uVar12 << 0x14) & 0x7fffffff | (uint)(uVar11 >> 0x2c)) + base;
  puVar18[0x15] = ((uint)(uVar12 >> 0xb) & 0x7fffffff) + base;
  puVar18[0x16] = ((uint)(uVar13 << 0x16) & 0x7fffffff | (uint)(uVar12 >> 0x2a)) + base;
  puVar18[0x17] = ((uint)(uVar13 >> 9) & 0x7fffffff) + base;
  puVar18[0x10] = ((uint)(ushort)(uVar9 >> 0x30) | (uint)(uVar10 << 0x10) & 0x7fffffff) + base;
  puVar18[0x11] = ((uint)(uVar10 >> 0xf) & 0x7fffffff) + base;
  puVar18[0x12] = ((uint)(uVar11 << 0x12) & 0x7fffffff | (uint)(uVar10 >> 0x2e)) + base;
  puVar18[0x13] = ((uint)(uVar11 >> 0xd) & 0x7fffffff) + base;
  puVar18[0x18] = ((uint)(uVar13 >> 0x28) | (uint)(uVar14 << 0x18) & 0x7fffffff) + base;
  puVar18[0x19] = ((uint)(uVar14 >> 7) & 0x7fffffff) + base;
  puVar18[0x1a] = ((uint)(uVar15 << 0x1a) & 0x7fffffff | (uint)(uVar14 >> 0x26)) + base;
  puVar18[0x1b] = ((uint)(uVar15 >> 5) & 0x7fffffff) + base;
  puVar18[0x1c] = ((uint)(uVar16 << 0x1c) & 0x7fffffff | (uint)(uVar15 >> 0x24)) + base;
  puVar18[0x1d] = ((uint)(uVar16 >> 3) & 0x7fffffff) + base;
  puVar18[0x1e] = ((uint)(uVar17 << 0x1e) & 0x7fffffff | (uint)(uVar16 >> 0x22)) + base;
  puVar18[0x1f] = ((uint)(uVar17 >> 1) & 0x7fffffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock31(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(2147483647);
  /* we are going to access  16 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  uint64_t w13 = pw64[13];
  uint64_t w14 = pw64[14];
  uint64_t w15 = pw64[15];
  *pw += 124; /* we used up 124 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 31) & mask);
  out[2] = base + (uint32_t)(((w0 >> 62) | (w1 << 2)) & mask);
  out[3] = base + (uint32_t)((w1 >> 29) & mask);
  out[4] = base + (uint32_t)(((w1 >> 60) | (w2 << 4)) & mask);
  out[5] = base + (uint32_t)((w2 >> 27) & mask);
  out[6] = base + (uint32_t)(((w2 >> 58) | (w3 << 6)) & mask);
  out[7] = base + (uint32_t)((w3 >> 25) & mask);
  out[8] = base + (uint32_t)(((w3 >> 56) | (w4 << 8)) & mask);
  out[9] = base + (uint32_t)((w4 >> 23) & mask);
  out[10] = base + (uint32_t)(((w4 >> 54) | (w5 << 10)) & mask);
  out[11] = base + (uint32_t)((w5 >> 21) & mask);
  out[12] = base + (uint32_t)(((w5 >> 52) | (w6 << 12)) & mask);
  out[13] = base + (uint32_t)((w6 >> 19) & mask);
  out[14] = base + (uint32_t)(((w6 >> 50) | (w7 << 14)) & mask);
  out[15] = base + (uint32_t)((w7 >> 17) & mask);
  out[16] = base + (uint32_t)(((w7 >> 48) | (w8 << 16)) & mask);
  out[17] = base + (uint32_t)((w8 >> 15) & mask);
  out[18] = base + (uint32_t)(((w8 >> 46) | (w9 << 18)) & mask);
  out[19] = base + (uint32_t)((w9 >> 13) & mask);
  out[20] = base + (uint32_t)(((w9 >> 44) | (w10 << 20)) & mask);
  out[21] = base + (uint32_t)((w10 >> 11) & mask);
  out[22] = base + (uint32_t)(((w10 >> 42) | (w11 << 22)) & mask);
  out[23] = base + (uint32_t)((w11 >> 9) & mask);
  out[24] = base + (uint32_t)(((w11 >> 40) | (w12 << 24)) & mask);
  out[25] = base + (uint32_t)((w12 >> 7) & mask);
  out[26] = base + (uint32_t)(((w12 >> 38) | (w13 << 26)) & mask);
  out[27] = base + (uint32_t)((w13 >> 5) & mask);
  out[28] = base + (uint32_t)(((w13 >> 36) | (w14 << 28)) & mask);
  out[29] = base + (uint32_t)((w14 >> 3) & mask);
  out[30] = base + (uint32_t)(((w14 >> 34) | (w15 << 30)) & mask);
  out[31] = base + (uint32_t)((w15 >> 1) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}